

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v9::detail::write_ptr<char,fmt::v9::appender,unsigned_long>
                   (appender out,unsigned_long value,basic_format_specs<char> *specs)

{
  reserve_iterator<fmt::v9::appender> it;
  int iVar1;
  type tVar2;
  appender it_00;
  long in_RDX;
  anon_class_16_2_92d121e5 *in_RSI;
  buffer<char> *in_RDI;
  anon_class_16_2_92d121e5 write;
  size_t size;
  int num_digits;
  anon_class_16_2_92d121e5 *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  basic_format_specs<char> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffcc;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_10;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_8;
  
  local_10.container = in_RDI;
  iVar1 = count_digits<4,unsigned_long>((unsigned_long)in_stack_ffffffffffffffa0);
  tVar2 = to_unsigned<int>(0);
  if (in_RDX == 0) {
    reserve<fmt::v9::appender>((appender *)&local_10,(ulong)tVar2 + 2);
    it.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container._4_4_ =
         in_stack_ffffffffffffffcc;
    it.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container._0_4_ = iVar1;
    it_00 = write_ptr<char,_fmt::v9::appender,_unsigned_long>::anon_class_16_2_92d121e5::operator()
                      (in_RSI,it);
    local_8.container = (buffer<char> *)base_iterator<fmt::v9::appender>(local_10.container,it_00);
  }
  else {
    local_8.container =
         (buffer<char> *)
         write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_ptr<char,fmt::v9::appender,unsigned_long>(fmt::v9::appender,unsigned_long,fmt::v9::basic_format_specs<char>const*)::_lambda(fmt::v9::appender)_1_&>
                   (local_10.container,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                    in_stack_ffffffffffffffa0);
  }
  return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)local_8.container;
}

Assistant:

auto write_ptr(OutputIt out, UIntPtr value,
               const basic_format_specs<Char>* specs) -> OutputIt {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  auto write = [=](reserve_iterator<OutputIt> it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_uint<4, Char>(it, value, num_digits);
  };
  return specs ? write_padded<align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}